

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::ADC_ID_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  
  this->cycles = 5;
  bVar7 = this->A;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar2 = ReadWord(this,(ushort)iVar3 & 0xff);
  this->cycles = this->cycles - 1;
  uVar4 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->Y + uVar2));
  uVar5 = ((this->field_6).ps & 1) + (uint)this->A + (uVar4 & 0xff);
  bVar1 = (byte)uVar5;
  this->A = bVar1;
  uVar6 = bVar7 & 0xffffff80;
  bVar7 = ((bVar1 & 0x80) != (byte)uVar6) << 6;
  if ((uVar4 & 0x80) != uVar6) {
    bVar7 = 0;
  }
  (this->field_6).ps =
       (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x3c | 0xff < uVar5 | bVar7 | bVar1 & 0x80;
  return;
}

Assistant:

void CPU::ADC_ID_Y()
{
    cycles = 5;
    uint8_t acp = A, op = ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}